

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O2

char * ngx_http_upstream_init_main_conf(ngx_conf_t *cf,void *conf)

{
  long lVar1;
  u_char *puVar2;
  code *pcVar3;
  long lVar4;
  size_t *psVar5;
  ngx_uint_t nVar6;
  ngx_int_t nVar7;
  ulong uVar8;
  ngx_http_upstream_header_t *pnVar9;
  undefined1 local_90 [8];
  ngx_hash_init_t hash;
  ngx_array_t headers_in;
  
  lVar1 = *(long *)((long)conf + 0x10);
  uVar8 = 0;
  do {
    if (*(ulong *)((long)conf + 0x18) <= uVar8) {
      hash.temp_pool = (ngx_pool_t *)ngx_palloc(cf->temp_pool,0x400);
      if (hash.temp_pool == (ngx_pool_t *)0x0) {
        return (char *)0xffffffffffffffff;
      }
      pnVar9 = ngx_http_upstream_headers_in;
      while( true ) {
        if ((pnVar9->name).len == 0) {
          hash.hash = (ngx_hash_t *)ngx_hash_key_lc;
          hash.key = (ngx_hash_key_pt)0x200;
          hash.max_size = -ngx_cacheline_size & ngx_cacheline_size + 0x3f;
          hash.bucket_size = (ngx_uint_t)anon_var_dwarf_79ae1;
          hash.name = (char *)cf->pool;
          hash.pool = (ngx_pool_t *)0x0;
          local_90 = (undefined1  [8])conf;
          nVar7 = ngx_hash_init((ngx_hash_init_t *)local_90,(ngx_hash_key_t *)hash.temp_pool,0);
          return (char *)-(ulong)(nVar7 != 0);
        }
        psVar5 = (size_t *)ngx_array_push((ngx_array_t *)&hash.temp_pool);
        if (psVar5 == (size_t *)0x0) break;
        puVar2 = (pnVar9->name).data;
        *psVar5 = (pnVar9->name).len;
        psVar5[1] = (size_t)puVar2;
        nVar6 = ngx_hash_key_lc((pnVar9->name).data,(pnVar9->name).len);
        psVar5[2] = nVar6;
        psVar5[3] = (size_t)pnVar9;
        pnVar9 = pnVar9 + 1;
      }
      return (char *)0xffffffffffffffff;
    }
    pcVar3 = (code *)**(long **)(lVar1 + uVar8 * 8);
    if (pcVar3 == (code *)0x0) {
      pcVar3 = ngx_http_upstream_init_round_robin;
    }
    lVar4 = (*pcVar3)(cf);
    uVar8 = uVar8 + 1;
  } while (lVar4 == 0);
  return (char *)0xffffffffffffffff;
}

Assistant:

static char *
ngx_http_upstream_init_main_conf(ngx_conf_t *cf, void *conf)
{
    ngx_http_upstream_main_conf_t  *umcf = conf;

    ngx_uint_t                      i;
    ngx_array_t                     headers_in;
    ngx_hash_key_t                 *hk;
    ngx_hash_init_t                 hash;
    ngx_http_upstream_init_pt       init;
    ngx_http_upstream_header_t     *header;
    ngx_http_upstream_srv_conf_t  **uscfp;

    uscfp = umcf->upstreams.elts;

    for (i = 0; i < umcf->upstreams.nelts; i++) {

        init = uscfp[i]->peer.init_upstream ? uscfp[i]->peer.init_upstream:
                                            ngx_http_upstream_init_round_robin;

        if (init(cf, uscfp[i]) != NGX_OK) {
            return NGX_CONF_ERROR;
        }
    }


    /* upstream_headers_in_hash */

    if (ngx_array_init(&headers_in, cf->temp_pool, 32, sizeof(ngx_hash_key_t))
        != NGX_OK)
    {
        return NGX_CONF_ERROR;
    }

    for (header = ngx_http_upstream_headers_in; header->name.len; header++) {
        hk = ngx_array_push(&headers_in);
        if (hk == NULL) {
            return NGX_CONF_ERROR;
        }

        hk->key = header->name;
        hk->key_hash = ngx_hash_key_lc(header->name.data, header->name.len);
        hk->value = header;
    }

    hash.hash = &umcf->headers_in_hash;
    hash.key = ngx_hash_key_lc;
    hash.max_size = 512;
    hash.bucket_size = ngx_align(64, ngx_cacheline_size);
    hash.name = "upstream_headers_in_hash";
    hash.pool = cf->pool;
    hash.temp_pool = NULL;

    if (ngx_hash_init(&hash, headers_in.elts, headers_in.nelts) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}